

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O3

void jpc_restore_t2state(jpc_enc_t *enc)

{
  uint uVar1;
  jpc_enc_cblk_t *pjVar2;
  jpc_enc_tcmpt_t *pjVar3;
  ulong uVar4;
  jpc_enc_tcmpt_t *pjVar5;
  long lVar6;
  uint uVar7;
  jpc_enc_band_t *pjVar8;
  jpc_enc_rlvl_t *pjVar9;
  jpc_enc_band_t *pjVar10;
  jpc_enc_prc_t *pjVar11;
  jpc_enc_rlvl_t *pjVar12;
  
  uVar4 = (ulong)enc->curtile->numtcmpts;
  if (uVar4 != 0) {
    pjVar3 = enc->curtile->tcmpts;
    pjVar5 = pjVar3 + uVar4;
    do {
      if ((ulong)pjVar3->numrlvls != 0) {
        pjVar12 = pjVar3->rlvls;
        pjVar9 = pjVar12 + pjVar3->numrlvls;
        do {
          pjVar10 = pjVar12->bands;
          if ((pjVar10 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar12->numbands != 0)) {
            pjVar8 = pjVar10 + pjVar12->numbands;
            do {
              if ((pjVar10->data != (jas_matrix_t *)0x0) && (pjVar12->numprcs != 0)) {
                pjVar11 = pjVar10->prcs;
                uVar7 = 0;
                do {
                  if (pjVar11->cblks != (jpc_enc_cblk_t *)0x0) {
                    jpc_tagtree_copy(pjVar11->incltree,pjVar11->savincltree);
                    jpc_tagtree_copy(pjVar11->nlibtree,pjVar11->savnlibtree);
                    uVar1 = pjVar11->numcblks;
                    if ((ulong)uVar1 != 0) {
                      pjVar2 = pjVar11->cblks;
                      lVar6 = 0;
                      do {
                        *(undefined8 *)((long)&pjVar2->curpass + lVar6) =
                             *(undefined8 *)((long)&pjVar2->savedcurpass + lVar6);
                        *(undefined4 *)((long)&pjVar2->numencpasses + lVar6) =
                             *(undefined4 *)((long)&pjVar2->savednumencpasses + lVar6);
                        *(undefined4 *)((long)&pjVar2->numlenbits + lVar6) =
                             *(undefined4 *)((long)&pjVar2->savednumlenbits + lVar6);
                        lVar6 = lVar6 + 0x68;
                      } while ((ulong)uVar1 * 0x68 - lVar6 != 0);
                    }
                  }
                  uVar7 = uVar7 + 1;
                  pjVar11 = pjVar11 + 1;
                } while (uVar7 < pjVar12->numprcs);
              }
              pjVar10 = pjVar10 + 1;
            } while (pjVar10 != pjVar8);
          }
          pjVar12 = pjVar12 + 1;
        } while (pjVar12 != pjVar9);
      }
      pjVar3 = pjVar3 + 1;
    } while (pjVar3 != pjVar5);
  }
  return;
}

Assistant:

void jpc_restore_t2state(jpc_enc_t *enc)
{

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_tile_t *tile;
	unsigned prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					jpc_tagtree_copy(prc->incltree, prc->savincltree);
					jpc_tagtree_copy(prc->nlibtree, prc->savnlibtree);
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->curpass = cblk->savedcurpass;
						cblk->numencpasses = cblk->savednumencpasses;
						cblk->numlenbits = cblk->savednumlenbits;
					}
				}
			}
		}
	}
}